

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O0

JavascriptString * __thiscall Js::BoundFunction::GetDisplayNameImpl(BoundFunction *this)

{
  RecyclableObject *instance;
  bool bVar1;
  JavascriptLibrary *pJVar2;
  RecyclableObject **ppRVar3;
  RecyclableObject *this_00;
  ScriptContext *requestContext;
  Var aValue;
  JavascriptString *pJVar4;
  Var value;
  JavascriptString *displayName;
  BoundFunction *this_local;
  
  pJVar2 = RecyclableObject::GetLibrary((RecyclableObject *)this);
  value = JavascriptLibrary::GetEmptyString(pJVar2);
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->targetFunction);
  if (*ppRVar3 != (RecyclableObject *)0x0) {
    ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->targetFunction);
    instance = *ppRVar3;
    this_00 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->targetFunction);
    requestContext = RecyclableObject::GetScriptContext(this_00);
    aValue = Js::JavascriptOperators::GetPropertyNoCache(instance,0x106,requestContext);
    bVar1 = VarIs<Js::JavascriptString>(aValue);
    if (bVar1) {
      value = VarTo<Js::JavascriptString>(aValue);
    }
  }
  pJVar2 = RecyclableObject::GetLibrary((RecyclableObject *)this);
  pJVar4 = JavascriptLibrary::GetBoundFunctionPrefixString(pJVar2);
  pJVar4 = JavascriptString::Concat(pJVar4,(JavascriptString *)value);
  return pJVar4;
}

Assistant:

JavascriptString* BoundFunction::GetDisplayNameImpl() const
    {
        JavascriptString* displayName = GetLibrary()->GetEmptyString();
        if (targetFunction != nullptr)
        {
            Var value = JavascriptOperators::GetPropertyNoCache(targetFunction, PropertyIds::name, targetFunction->GetScriptContext());
            if (VarIs<JavascriptString>(value))
            {
                displayName = VarTo<JavascriptString>(value);
            }
        }
        return JavascriptString::Concat(GetLibrary()->GetBoundFunctionPrefixString(), displayName);
    }